

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * indigox::utils::randomString_abi_cxx11_(size_t length)

{
  int iVar1;
  long in_RSI;
  string *in_RDI;
  String *s;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec38;
  undefined4 in_stack_ffffffffffffec40;
  result_type_conflict in_stack_ffffffffffffec44;
  random_device *in_stack_ffffffffffffec80;
  long local_10;
  
  if ((randomString[abi:cxx11](unsigned_long)::rg == '\0') &&
     (iVar1 = __cxa_guard_acquire(&randomString[abi:cxx11](unsigned_long)::rg), iVar1 != 0)) {
    std::random_device::random_device(in_stack_ffffffffffffec80);
    in_stack_ffffffffffffec44 = std::random_device::operator()((random_device *)0x128554);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)CONCAT44(in_stack_ffffffffffffec44,in_stack_ffffffffffffec40),
               (result_type)in_stack_ffffffffffffec38);
    std::random_device::~random_device((random_device *)0x12857a);
    __cxa_guard_release(&randomString[abi:cxx11](unsigned_long)::rg);
  }
  if ((randomString[abi:cxx11](unsigned_long)::pick == '\0') &&
     (iVar1 = __cxa_guard_acquire(&randomString[abi:cxx11](unsigned_long)::pick), iVar1 != 0)) {
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffec44,in_stack_ffffffffffffec40),
               (unsigned_long)in_stack_ffffffffffffec38,0x1285b5);
    __cxa_guard_release(&randomString[abi:cxx11](unsigned_long)::pick);
  }
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_10 = in_RSI;
  while (local_10 != 0) {
    in_stack_ffffffffffffec38 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       CONCAT44(in_stack_ffffffffffffec44,in_stack_ffffffffffffec40),
                       in_stack_ffffffffffffec38);
    std::__cxx11::string::operator+=
              (in_RDI,*(char *)((long)in_stack_ffffffffffffec38[0x151]._M_x + 0xe67));
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

String randomString(size_t length) {
      static auto& chrs = "qwertyuiopasdfghjklzxcvbnmZAQXSWCDEVFRBGTNHYMJUKILOP";
      
      static std::mt19937 rg{std::random_device{}()};
      static std::uniform_int_distribution<size_t> pick(0, sizeof(chrs) - 2);
      
      String s;
      s.reserve(length + 4);  // no need to copy when adding extensions
      
      while(length--)
        s += chrs[pick(rg)];
      return s;
      
    }